

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsSplitDeque.h
# Opt level: O1

HighsTask * __thiscall
HighsSplitDeque::WorkerBunk::waitForNewTask(WorkerBunk *this,HighsSplitDeque *localDeque)

{
  ulong uVar1;
  ulong uVar2;
  HighsSplitDeque *pHVar3;
  bool bVar4;
  
  uVar1 = (this->sleeperStack).super___atomic_base<unsigned_long>._M_i;
  do {
    if ((uVar1 & 0xfffff) == 0) {
      pHVar3 = (HighsSplitDeque *)0x0;
    }
    else {
      pHVar3 = (localDeque->ownerData).workers[(uVar1 & 0xfffff) - 1]._M_t.
               super___uniq_ptr_impl<HighsSplitDeque,_highs::cache_aligned::Deleter<HighsSplitDeque>_>
               ._M_t.
               super__Tuple_impl<0UL,_HighsSplitDeque_*,_highs::cache_aligned::Deleter<HighsSplitDeque>_>
               .super__Head_base<0UL,_HighsSplitDeque_*,_false>._M_head_impl;
    }
    (localDeque->workerBunkData).nextSleeper._M_b._M_p = pHVar3;
    LOCK();
    uVar2 = (this->sleeperStack).super___atomic_base<unsigned_long>._M_i;
    bVar4 = uVar1 == uVar2;
    if (bVar4) {
      (this->sleeperStack).super___atomic_base<unsigned_long>._M_i =
           (long)(localDeque->workerBunkData).ownerId + 1U | (uVar1 & 0xfffffffffff00000) + 0x100000
      ;
      uVar2 = uVar1;
    }
    UNLOCK();
    uVar1 = uVar2;
  } while (!bVar4);
  HighsBinarySemaphore::acquire(&(localDeque->stealerData).semaphore);
  return (localDeque->stealerData).injectedTask;
}

Assistant:

HighsTask* waitForNewTask(HighsSplitDeque* localDeque) {
      pushSleeper(localDeque);
      localDeque->stealerData.semaphore.acquire();
      return localDeque->stealerData.injectedTask;
    }